

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_connection::
coro_http_connection<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>>
          (coro_http_connection *this,
          ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
          *executor,socket *socket,coro_http_router *router)

{
  rep rVar1;
  allocator<char> local_6a;
  allocator<char> local_69 [17];
  string *local_58;
  coro_http_request *local_50;
  streambuf *local_48;
  streambuf *local_40;
  socket *local_38;
  
  (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
  super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<cinatra::coro_http_connection>)._M_weak_this.
  super___weak_ptr<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->executor_ = executor;
  local_38 = &this->socket_;
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::basic_socket
            (&local_38->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,
             &socket->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>);
  this->router_ = router;
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->head_buf_,0xffffffffffffffff,local_69);
  (this->body_)._M_dataplus._M_p = (pointer)&(this->body_).field_2;
  (this->body_)._M_string_length = 0;
  (this->body_).field_2._M_local_buf[0] = '\0';
  local_40 = &this->head_buf_;
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            (&this->chunked_buf_,0xffffffffffffffff,&local_6a);
  local_48 = &this->chunked_buf_;
  http_parser::http_parser(&this->parser_);
  local_50 = &this->request_;
  coro_http_request::coro_http_request(local_50,&this->parser_,this);
  coro_http_response::coro_http_response(&this->response_,this);
  *(undefined8 *)
   ((long)&(this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->buffers_).
           super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->buffers_).super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->conn_id_ = 0;
  *(undefined8 *)&(this->quit_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->quit_cb_).super__Function_base._M_functor + 8) = 0;
  (this->quit_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)((long)&(this->quit_cb_).super__Function_base._M_manager + 1) = 0;
  *(undefined8 *)((long)&(this->quit_cb_)._M_invoker + 1) = 0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->last_rwtime_)._M_i.__d.__r = rVar1;
  this->max_part_size_ = 0x800000;
  (this->resp_str_)._M_dataplus._M_p = (pointer)&(this->resp_str_).field_2;
  (this->resp_str_)._M_string_length = 0;
  (this->resp_str_).field_2._M_local_buf[0] = '\0';
  (this->ws_).sec_ws_key_._M_len = 0;
  (this->ws_).sec_ws_key_._M_str = (char *)0x0;
  (this->ws_).payload_length_ = 0;
  (this->ws_).left_header_len_ = 2;
  (this->ws_).mask_key_[0] = '\0';
  (this->ws_).mask_key_[1] = '\0';
  (this->ws_).mask_key_[2] = '\0';
  (this->ws_).mask_key_[3] = '\0';
  (this->ws_).msg_opcode_ = '\0';
  (this->ws_).msg_fin_ = '\0';
  local_58 = &this->resp_str_;
  (this->ws_).len_bytes_ = SHORT_HEADER;
  this->need_shrink_every_time_ = false;
  this->multi_buf_ = true;
  *(undefined8 *)&(this->default_handler_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->default_handler_).super__Function_base._M_functor + 8) = 0;
  (this->default_handler_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->default_handler_)._M_invoker = (_Invoker_type)0x0;
  (this->chunk_size_str_)._M_dataplus._M_p = (pointer)&(this->chunk_size_str_).field_2;
  (this->chunk_size_str_)._M_string_length = 0;
  (this->chunk_size_str_).field_2._M_local_buf[0] = '\0';
  (this->remote_addr_)._M_dataplus._M_p = (pointer)&(this->remote_addr_).field_2;
  (this->remote_addr_)._M_string_length = 0;
  (this->remote_addr_).field_2._M_local_buf[0] = '\0';
  this->max_http_body_len_ = 0;
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::reserve(&this->buffers_,3);
  return;
}

Assistant:

coro_http_connection(executor_t *executor, asio::ip::tcp::socket socket,
                       coro_http_router &router)
      : executor_(executor),
        socket_(std::move(socket)),
        router_(router),
        request_(parser_, this),
        response_(this) {
    buffers_.reserve(3);
  }